

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

uint64_t __thiscall bloaty::RangeSink::TranslateFileToVM(RangeSink *this,char *ptr)

{
  bool bVar1;
  const_pointer pvVar2;
  Arg *in_RSI;
  char *in_RDI;
  uint64_t translated;
  uint64_t offset;
  undefined8 in_stack_fffffffffffffec8;
  undefined1 value_00;
  Nullable<const_char_*> value;
  int line;
  Arg *in_stack_fffffffffffffee0;
  uint64_t *in_stack_fffffffffffffee8;
  uint64_t in_stack_fffffffffffffef0;
  Arg *in_stack_fffffffffffffef8;
  RangeSink *in_stack_ffffffffffffff00;
  Arg *in_stack_ffffffffffffff08;
  string_view in_stack_ffffffffffffff10;
  RangeMap *in_stack_ffffffffffffff88;
  uint64_t local_30;
  string_view local_28;
  long local_18;
  
  value_00 = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38);
  if (*(long *)(in_RDI + 0xf0) == 0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x54e,"uint64_t bloaty::RangeSink::TranslateFileToVM(const char *)");
  }
  local_28 = InputFile::data(*(InputFile **)in_RDI);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_28);
  local_18 = (long)in_RSI - (long)pvVar2;
  bVar1 = FileContainsPointer(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if ((bVar1) &&
     (bVar1 = RangeMap::Translate((RangeMap *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                  in_stack_fffffffffffffee8), bVar1)) {
    return local_30;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&in_stack_fffffffffffffee0->piece_,in_RDI);
  absl::substitute_internal::Arg::Arg(in_stack_fffffffffffffee0,(unsigned_long)in_RDI);
  line = (int)((ulong)in_RDI >> 0x20);
  FileContainsPointer(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  absl::substitute_internal::Arg::Arg(in_RSI,(bool)value_00);
  value = &stack0xfffffffffffffef0;
  RangeMap::DebugString_abi_cxx11_(in_stack_ffffffffffffff88);
  std::__cxx11::string::c_str();
  absl::substitute_internal::Arg::Arg(in_RSI,value);
  absl::Substitute_abi_cxx11_
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(Arg *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  std::__cxx11::string::c_str();
  Throw((char *)in_stack_fffffffffffffee0,line);
}

Assistant:

uint64_t RangeSink::TranslateFileToVM(const char* ptr) {
  assert(translator_);
  uint64_t offset = ptr - file_->data().data();
  uint64_t translated;
  if (!FileContainsPointer(ptr) ||
      !translator_->file_map.Translate(offset, &translated)) {
    THROWF("Can't translate file offset ($0) to VM, contains: $1, map:\n$2",
           offset, FileContainsPointer(ptr),
           translator_->file_map.DebugString().c_str());
  }
  return translated;
}